

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O2

void __thiscall RandomizerWorld::load_nodes(RandomizerWorld *this)

{
  pointer ppIVar1;
  ItemSource *source;
  bool bVar2;
  string_type *id;
  reference json;
  WorldNode *pWVar3;
  mapped_type *ppWVar4;
  pointer ppIVar5;
  Json nodes_json;
  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_178 [4];
  _Any_data local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __end1;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __begin1;
  
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_148 = 0;
  uStack_140 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[10143]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&nodes_json,
             (uchar (*) [10143])
             "{\n    \"massan\": {\n        \"name\": \"Massan\",\n        \"hints\": [\n            \"in a village\",\n            \"in a region inhabited by bears\",\n            \"in the village of Massan\"\n        ]\n    },\n    \"massan_cave\": {\n        \"name\": \"Massan Cave\",\n        \"hints\": [\n            \"in a large cave\",\n            \"in a region inhabited by bears\",\n            \"in Massan cave\"\n        ]\n    },\n    \"route_massan_gumi\": {\n        \"name\": \"Route between Massan and Gumi\",\n        \"hints\": [\n            \"on a route\",\n            \"in a region inhabited by bears\",\n            \"between Massan and Gumi\"\n        ]\n    },\n    \"waterfall_shrine\": {\n        \"name\": \"Waterfall Shrine\",\n        \"hints\": [\n            \"in a shrine\",\n            \"close to a waterfall\",\n            \"in a region inhabited by bears\",\n            \"in Waterfall Shrine\"\n        ]\n    },\n    \"swamp_shrine\": {\n        \"name\": \"Swamp Shrine\",\n        \"hints\": [\n            \"in a shrine\",\n            \"near a swamp\",\n            \"in a region inhabited by bears\",\n            \"in Swamp Shrine\"\n        ]\n    },\n    \"massan_after_swamp_shrine\": {\n        \"name\": \"Massan (after Swamp Shrine)\",\n        \"hints\": [\n            \"in a village\",\n            \"in a region inhabited by bears\",\n            \"in the village of Massan\"\n        ]\n    },\n    \"gumi_after_swamp_shrine\": {\n        \"name\": \"Gumi (after Swamp Shrine)\",\n        \"hints\": [\n            \"in a village\",\n            \"in a region inhabited by bears\",\n            \"in the village of Gumi\"\n        ]\n    },\n    \"gumi\": {\n        \"name\": \"Gumi\",\n        \"hints\": [\n            \"in a village\",\n            \"in a region inhabited by bears\",\n            \"in the village of Gumi\"\n        ]\n    },\n    \"route_gumi_ryuma\": {\n        \"name\": \"Route from Gumi to Ryuma\",\n        \"hints\": [\n            \"on a route\",\n            \"in a region inhabited by bears\",\n            \"between Gumi and Ryuma\"\n        ]\n    },\n    \"tibor\": {\n        \"name\": \"Tibor\",\n        \"hints\": [\n            \"among the trees\",\n            \"inside the elder t..." /* TRUNCATED STRING LITERAL */
             ,(parser_callback_t *)&local_158,true,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  local_178[0].container = &nodes_json;
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin(&__begin1,local_178);
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end(&__end1,local_178);
  while( true ) {
    bVar2 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&__begin1.anchor,&__end1.anchor);
    if (!bVar2) break;
    id = nlohmann::detail::
         iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::key(&__begin1);
    json = nlohmann::detail::
           iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*(&__begin1.anchor);
    pWVar3 = WorldNode::from_json(id,json);
    ppWVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
              ::operator[](&this->_nodes,id);
    *ppWVar4 = pWVar3;
    nlohmann::detail::
    iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator++(&__begin1);
  }
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~iteration_proxy_value(&__end1);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~iteration_proxy_value(&__begin1);
  ppIVar1 = (this->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar5 = (this->_item_sources).
                 super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar5 != ppIVar1; ppIVar5 = ppIVar5 + 1) {
    source = *ppIVar5;
    ppWVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
              ::at(&this->_nodes,&source->_node_id);
    WorldNode::add_item_source(*ppWVar4,source);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&nodes_json);
  return;
}

Assistant:

void RandomizerWorld::load_nodes()
{
    Json nodes_json = Json::parse(WORLD_NODES_JSON);
    for(auto& [node_id, node_json] : nodes_json.items())
    {
        WorldNode* new_node = WorldNode::from_json(node_id, node_json);
        _nodes[node_id] = new_node;
    }

    for(ItemSource* source : this->item_sources())
    {
        const std::string& node_id = source->node_id();
        try {
            _nodes.at(node_id)->add_item_source(source);
        } catch(std::out_of_range&) {
            throw LandstalkerException("Could not find node '" + node_id + "' referenced by item source '" + source->name() + "'");
        }
    }
}